

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeDeviceGetFabricVertexExp(ze_device_handle_t hDevice,ze_fabric_vertex_handle_t *phVertex)

{
  object_t<_ze_fabric_vertex_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnDeviceGetFabricVertexExp_t pfnGetFabricVertexExp;
  dditable_t *dditable;
  ze_fabric_vertex_handle_t *pp_Stack_20;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phVertex_local;
  ze_device_handle_t hDevice_local;
  
  dditable._4_4_ = 0;
  pfnGetFabricVertexExp = *(ze_pfnDeviceGetFabricVertexExp_t *)(hDevice + 8);
  if (*(code **)(pfnGetFabricVertexExp + 400) == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    phVertex_local = *(ze_fabric_vertex_handle_t **)hDevice;
    pp_Stack_20 = phVertex;
    dditable._4_4_ = (**(code **)(pfnGetFabricVertexExp + 400))(phVertex_local,phVertex);
    hDevice_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
               ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                           *)(context + 0x360),pp_Stack_20,(dditable_t **)&pfnGetFabricVertexExp);
      *pp_Stack_20 = (ze_fabric_vertex_handle_t)poVar1;
      hDevice_local._4_4_ = dditable._4_4_;
    }
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetFabricVertexExp(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_fabric_vertex_handle_t* phVertex             ///< [out] fabric vertex handle corresponding to device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_device_object_t*>( hDevice )->dditable;
        auto pfnGetFabricVertexExp = dditable->ze.DeviceExp.pfnGetFabricVertexExp;
        if( nullptr == pfnGetFabricVertexExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnGetFabricVertexExp( hDevice, phVertex );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phVertex = reinterpret_cast<ze_fabric_vertex_handle_t>(
                context->ze_fabric_vertex_factory.getInstance( *phVertex, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }